

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoundingSphereRecord.cpp
# Opt level: O0

KString * __thiscall
KDIS::DATA_TYPE::BoundingSphereRecord::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,BoundingSphereRecord *this)

{
  ostream *poVar1;
  KString local_1f0;
  KString local_1c0;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  BoundingSphereRecord *local_18;
  BoundingSphereRecord *this_local;
  
  local_18 = this;
  this_local = (BoundingSphereRecord *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  EnvironmentRecord::GetAsString_abi_cxx11_(&local_1c0,&this->super_EnvironmentRecord);
  poVar1 = std::operator<<(local_190,(string *)&local_1c0);
  poVar1 = std::operator<<(poVar1,"\tCentroid Location: ");
  WorldCoordinates::GetAsString_abi_cxx11_(&local_1f0,&this->m_CentLocation);
  poVar1 = std::operator<<(poVar1,(string *)&local_1f0);
  poVar1 = std::operator<<(poVar1,"\tRadius:   ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(float)this->m_f32Rad);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString BoundingSphereRecord::GetAsString() const
{
    KStringStream ss;

    ss << EnvironmentRecord::GetAsString()
       << "\tCentroid Location: " <<  m_CentLocation.GetAsString()
       << "\tRadius:   "          <<  m_f32Rad << "\n";

    return ss.str();
}